

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O0

void __thiscall
cfgfile::lexical_analyzer_t<cfgfile::qstring_trait_t>::skip_spaces
          (lexical_analyzer_t<cfgfile::qstring_trait_t> *this)

{
  bool bVar1;
  input_stream_t<cfgfile::qstring_trait_t> *in_RDI;
  char_t unaff_retaddr;
  char_t unaff_retaddr_00;
  char_t ch;
  
  bVar1 = input_stream_t<cfgfile::qstring_trait_t>::at_end(in_RDI);
  if (!bVar1) {
    input_stream_t<cfgfile::qstring_trait_t>::get(in_RDI);
    while (bVar1 = is_space_char((lexical_analyzer_t<cfgfile::qstring_trait_t> *)in_RDI,
                                 unaff_retaddr), bVar1) {
      bVar1 = input_stream_t<cfgfile::qstring_trait_t>::at_end(in_RDI);
      if (bVar1) {
        return;
      }
      input_stream_t<cfgfile::qstring_trait_t>::get(in_RDI);
    }
    input_stream_t<cfgfile::qstring_trait_t>::put_back(in_RDI,unaff_retaddr_00);
  }
  return;
}

Assistant:

void skip_spaces()
	{
		if( m_stream.at_end() )
			return;

		typename Trait::char_t ch = m_stream.get();

		while( is_space_char( ch ) )
		{
			if( m_stream.at_end() )
				return;

			ch = m_stream.get();
		}

		m_stream.put_back( ch );
	}